

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::GetLine_abi_cxx11_(string *__return_storage_ptr__,Parser *this,unsigned_long i)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  allocator local_31;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    uVar1 = std::__cxx11::string::find((char *)&this->m_Buffer,0x1554d2);
    if (uVar1 == 0xffffffffffffffff) {
      if (i != 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
        return __return_storage_ptr__;
      }
      break;
    }
    bVar3 = i != 0;
    i = i - 1;
  } while ((bVar3) || (~uVar2 + uVar1 == 0));
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->m_Buffer);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetLine(unsigned long i) const
{
 unsigned long lines = 0;
 size_t prec = 0;
 auto pos = m_Buffer.find("\n", 0);
 while(pos != std::string::npos)
   {
   if(lines == i)
     {
     if(pos-prec-1>0)
       {
       return m_Buffer.substr(prec,pos-prec-1);
       }
     }
   lines++;
   prec = pos;
   pos = m_Buffer.find("\n",pos+1);
   }

  if(lines == i)
    {
    return m_Buffer.substr(prec,m_Buffer.size()-prec);
    }

 return "";
}